

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::
Dispatch<absl::lts_20250127::str_format_internal::VoidPtr>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  FormatConversionSpecImpl conv;
  FormatConversionChar FVar1;
  bool bVar2;
  ArgConvertResult<(absl::lts_20250127::FormatConversionCharSet)262144> AVar3;
  FormatConversionCharSet set;
  VoidPtr v;
  FormatSinkImpl *sink;
  void *out_local;
  Data local_24;
  FormatConversionSpecImpl spec_local;
  Data arg_local;
  
  sink = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_);
  spec_local._0_4_ = spec._0_4_;
  local_24 = arg;
  spec_local._4_8_ = this;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
  if (FVar1 == 0x13) {
    arg_local.buf[7] =
         ToInt<absl::lts_20250127::str_format_internal::VoidPtr>(spec_local._4_8_,sink);
  }
  else {
    set = ArgumentToConv<absl::lts_20250127::str_format_internal::VoidPtr>();
    FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)&local_24);
    bVar2 = Contains(set,FVar1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      v = Manager<absl::lts_20250127::str_format_internal::VoidPtr,_(absl::lts_20250127::str_format_internal::FormatArgImpl::StoragePolicy)2>
          ::Value((Data)spec_local._4_8_);
      conv.precision_._0_1_ = spec_local.conv_;
      conv.precision_._1_1_ = spec_local.flags_;
      conv.precision_._2_1_ = spec_local.length_mod_;
      conv.precision_._3_1_ = spec_local._3_1_;
      conv._0_8_ = local_24.ptr;
      AVar3 = str_format_internal::FormatConvertImpl(v,conv,sink);
      arg_local.buf[7] = AVar3.value & 1;
    }
    else {
      arg_local.buf[7] = '\0';
    }
  }
  return (bool)arg_local.buf[7];
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }